

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_EditionDefaultsInvalidMinimumTwice_Test::TestBody
          (CommandLineInterfaceTest_EditionDefaultsInvalidMinimumTwice_Test *this)

{
  Descriptor *pDVar1;
  string_view name;
  string_view expected_substring;
  string_view contents;
  string local_50;
  string local_30;
  
  pDVar1 = DescriptorProto::GetDescriptor();
  FileDescriptor::DebugString_abi_cxx11_(&local_30,pDVar1->file_);
  name._M_str = "google/protobuf/descriptor.proto";
  name._M_len = 0x20;
  contents._M_str = local_30._M_dataplus._M_p;
  contents._M_len = local_30._M_string_length;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "protocol_compiler --proto_path=$tmpdir --edition_defaults_minimum=2023 --edition_defaults_minimum=2023 google/protobuf/descriptor.proto"
             ,(allocator<char> *)&local_30);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  expected_substring._M_str = "edition_defaults_minimum may only be passed once";
  expected_substring._M_len = 0x30;
  CommandLineInterfaceTester::ExpectErrorSubstring
            ((CommandLineInterfaceTester *)this,expected_substring);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, EditionDefaultsInvalidMinimumTwice) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  Run("protocol_compiler --proto_path=$tmpdir "
      "--edition_defaults_minimum=2023 "
      "--edition_defaults_minimum=2023 "
      "google/protobuf/descriptor.proto");
  ExpectErrorSubstring("edition_defaults_minimum may only be passed once");
}